

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reorder.hpp
# Opt level: O0

void MGARD::data_reorder_1D<float>
               (float *data_pos,size_t n_nodal,size_t n_coeff,float *nodal_buffer,
               float *coeff_buffer)

{
  float *pfVar1;
  int i;
  float *cur_data_pos;
  float *coeff_pos;
  float *nodal_pos;
  float *coeff_buffer_local;
  float *nodal_buffer_local;
  size_t n_coeff_local;
  size_t n_nodal_local;
  float *data_pos_local;
  
  cur_data_pos = data_pos;
  coeff_pos = coeff_buffer;
  nodal_pos = nodal_buffer;
  for (i = 0; (ulong)(long)i < n_coeff; i = i + 1) {
    pfVar1 = cur_data_pos + 1;
    *nodal_pos = *cur_data_pos;
    cur_data_pos = cur_data_pos + 2;
    *coeff_pos = *pfVar1;
    coeff_pos = coeff_pos + 1;
    nodal_pos = nodal_pos + 1;
  }
  *nodal_pos = *cur_data_pos;
  if (n_nodal == n_coeff + 2) {
    nodal_pos[1] = cur_data_pos[1] + cur_data_pos[1] + -*nodal_pos;
  }
  return;
}

Assistant:

void data_reorder_1D(const T * data_pos, size_t n_nodal, size_t n_coeff, T * nodal_buffer, T * coeff_buffer){
    T * nodal_pos = nodal_buffer;
    T * coeff_pos = coeff_buffer;
    T const * cur_data_pos = data_pos;
    for(int i=0; i<n_coeff; i++){
        *(nodal_pos++) = *(cur_data_pos++);
        *(coeff_pos++) = *(cur_data_pos++);
    }
    *(nodal_pos++) = *(cur_data_pos++);
    if(n_nodal == n_coeff + 2){
        // if even, add a nodal value such that the interpolant
        // of the last two nodal values equal to the last coefficient
        *nodal_pos = 2*cur_data_pos[0] - nodal_pos[-1];
    }
}